

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadStructure(ColladaParser *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  cVar1 = (char)iVar3;
  while (cVar1 != '\0') {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 1) {
      if (iVar4 != 1) {
LAB_0041137f:
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"asset");
      if (iVar3 == 0) {
        ReadAssetInfo(this);
      }
      else {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) goto LAB_0041137f;
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"library_animations");
        if (iVar3 == 0) {
          ReadAnimationLibrary(this);
        }
        else {
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar3 != 1) goto LAB_0041137f;
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"library_animation_clips");
          if (iVar3 == 0) {
            ReadAnimationClipLibrary(this);
          }
          else {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar3 != 1) goto LAB_0041137f;
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"library_controllers");
            if (iVar3 == 0) {
              ReadControllerLibrary(this);
            }
            else {
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar3 != 1) goto LAB_0041137f;
              iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"library_images");
              if (iVar3 == 0) {
                ReadImageLibrary(this);
              }
              else {
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar3 != 1) goto LAB_0041137f;
                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar3 = strcmp((char *)CONCAT44(extraout_var_04,iVar3),"library_materials");
                if (iVar3 == 0) {
                  ReadMaterialLibrary(this);
                }
                else {
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar3 != 1) goto LAB_0041137f;
                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar3 = strcmp((char *)CONCAT44(extraout_var_05,iVar3),"library_effects");
                  if (iVar3 == 0) {
                    ReadEffectLibrary(this);
                  }
                  else {
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar3 != 1) goto LAB_0041137f;
                    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar3 = strcmp((char *)CONCAT44(extraout_var_06,iVar3),"library_geometries");
                    if (iVar3 == 0) {
                      ReadGeometryLibrary(this);
                    }
                    else {
                      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                      if (iVar3 != 1) goto LAB_0041137f;
                      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar3 = strcmp((char *)CONCAT44(extraout_var_07,iVar3),"library_visual_scenes"
                                    );
                      if (iVar3 == 0) {
                        ReadSceneLibrary(this);
                      }
                      else {
                        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                        if (iVar3 != 1) goto LAB_0041137f;
                        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        iVar3 = strcmp((char *)CONCAT44(extraout_var_08,iVar3),"library_lights");
                        if (iVar3 == 0) {
                          ReadLightLibrary(this);
                        }
                        else {
                          bVar2 = IsElement(this,"library_cameras");
                          if (bVar2) {
                            ReadCameraLibrary(this);
                          }
                          else {
                            bVar2 = IsElement(this,"library_nodes");
                            if (bVar2) {
                              ReadSceneNode(this,(Node *)0x0);
                            }
                            else {
                              bVar2 = IsElement(this,"scene");
                              if (bVar2) {
                                ReadScene(this);
                              }
                              else {
                                SkipElement(this);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else if (iVar4 == 2) break;
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    cVar1 = (char)iVar3;
  }
  PostProcessRootAnimations(this);
  PostProcessControllers(this);
  return;
}

Assistant:

void ColladaParser::ReadStructure()
{
    while (mReader->read())
    {
        // beginning of elements
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("asset"))
                ReadAssetInfo();
            else if (IsElement("library_animations"))
                ReadAnimationLibrary();
            else if (IsElement("library_animation_clips"))
                ReadAnimationClipLibrary();
            else if (IsElement("library_controllers"))
                ReadControllerLibrary();
            else if (IsElement("library_images"))
                ReadImageLibrary();
            else if (IsElement("library_materials"))
                ReadMaterialLibrary();
            else if (IsElement("library_effects"))
                ReadEffectLibrary();
            else if (IsElement("library_geometries"))
                ReadGeometryLibrary();
            else if (IsElement("library_visual_scenes"))
                ReadSceneLibrary();
            else if (IsElement("library_lights"))
                ReadLightLibrary();
            else if (IsElement("library_cameras"))
                ReadCameraLibrary();
            else if (IsElement("library_nodes"))
                ReadSceneNode(NULL); /* some hacking to reuse this piece of code */
            else if (IsElement("scene"))
                ReadScene();
            else
                SkipElement();
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            break;
        }
    }

    PostProcessRootAnimations();
    PostProcessControllers();
}